

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_tesc_invocation_id_abi_cxx11_(CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  Compiler *in_RSI;
  CompilerMSL *this_local;
  
  this_local = this;
  if (((ulong)in_RSI[3].ir.ids_for_type[6].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr & 0x10000000000) ==
      0) {
    (*in_RSI->_vptr_Compiler[0x14])(this,in_RSI,8,1);
  }
  else {
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)&stack0xffffffffffffffc8,(uint32_t)in_RSI,
               SUB41(*(undefined4 *)in_RSI[3].ir.ids_for_type[2].stack_storage.aligned_char,0));
    pSVar1 = Compiler::get_entry_point(in_RSI);
    join<std::__cxx11::string,char_const(&)[6],unsigned_int&>
              ((spirv_cross *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffc8,(char (*) [6])".x % ",&pSVar1->output_vertices);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return this;
}

Assistant:

string CompilerMSL::to_tesc_invocation_id()
{
	if (msl_options.multi_patch_workgroup)
	{
		// n.b. builtin_invocation_id_id here is the dispatch global invocation ID,
		// not the TC invocation ID.
		return join(to_expression(builtin_invocation_id_id), ".x % ", get_entry_point().output_vertices);
	}
	else
		return builtin_to_glsl(BuiltInInvocationId, StorageClassInput);
}